

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::Finalize<duckdb::CovarState,double,duckdb::CovarSampOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  idx_t iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_48.result_idx = 0;
    uVar1 = *(ulong *)**(long **)(states + 0x20);
    if (uVar1 < 2) {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      lVar5 = uVar1 - 1;
      auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = 0x45300000;
      **(double **)(result + 0x20) =
           (double)((ulong *)**(long **)(states + 0x20))[3] /
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar5 = *(long *)(states + 0x20);
    lVar2 = *(long *)(result + 0x20);
    if (count != 0) {
      iVar6 = 0;
      do {
        local_48.result_idx = offset + iVar6;
        puVar3 = *(ulong **)(lVar5 + iVar6 * 8);
        uVar1 = *puVar3;
        if (uVar1 < 2) {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          lVar4 = uVar1 - 1;
          auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar8._0_8_ = lVar4;
          auVar8._12_4_ = 0x45300000;
          *(double *)(lVar2 + offset * 8 + iVar6 * 8) =
               (double)puVar3[3] /
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}